

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O1

int arena_i_reset_ctl(tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
                     size_t newlen)

{
  int iVar1;
  ulong unaff_R14;
  arena_t *unaff_R15;
  
  if (((oldp == (void *)0x0 && oldlenp == (size_t *)0x0) && newp == (void *)0x0) && newlen == 0) {
    unaff_R14 = mib[1];
    iVar1 = 0xe;
    if (unaff_R14 >> 0x20 == 0) {
      unaff_R15 = (arena_t *)duckdb_je_arenas[unaff_R14].repr;
      if (unaff_R15 == (arena_t *)0x0) {
        unaff_R15 = (arena_t *)0x0;
      }
      if ((unaff_R15 != (arena_t *)0x0) &&
         (iVar1 = 0xe, duckdb_je_manual_arena_base <= unaff_R15->ind)) {
        iVar1 = 0;
      }
    }
  }
  else {
    iVar1 = 1;
  }
  if (iVar1 == 0) {
    arena_reset_prepare_background_thread(tsd,(uint)unaff_R14);
    duckdb_je_arena_reset(tsd,unaff_R15);
    arena_reset_finish_background_thread(tsd,(uint)unaff_R14);
  }
  return iVar1;
}

Assistant:

static int
arena_i_reset_ctl(tsd_t *tsd, const size_t *mib, size_t miblen, void *oldp,
    size_t *oldlenp, void *newp, size_t newlen) {
	int ret;
	unsigned arena_ind;
	arena_t *arena;

	ret = arena_i_reset_destroy_helper(tsd, mib, miblen, oldp, oldlenp,
	    newp, newlen, &arena_ind, &arena);
	if (ret != 0) {
		return ret;
	}

	arena_reset_prepare_background_thread(tsd, arena_ind);
	arena_reset(tsd, arena);
	arena_reset_finish_background_thread(tsd, arena_ind);

	return ret;
}